

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Btree * sqlite3DbNameToBtree(sqlite3 *db,char *zDbName)

{
  Btree *pBVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)db->nDb;
  if (db->nDb < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 * 0x20 == uVar4) {
      return (Btree *)0x0;
    }
    pBVar1 = *(Btree **)((long)&db->aDb->pBt + uVar4);
    if (pBVar1 != (Btree *)0x0) {
      if (zDbName == (char *)0x0) {
        return pBVar1;
      }
      iVar2 = sqlite3_stricmp(zDbName,*(char **)((long)&db->aDb->zName + uVar4));
      if (iVar2 == 0) {
        return pBVar1;
      }
    }
    uVar4 = uVar4 + 0x20;
  } while( true );
}

Assistant:

SQLITE_PRIVATE Btree *sqlite3DbNameToBtree(sqlite3 *db, const char *zDbName){
  int i;
  for(i=0; i<db->nDb; i++){
    if( db->aDb[i].pBt
     && (zDbName==0 || sqlite3StrICmp(zDbName, db->aDb[i].zName)==0)
    ){
      return db->aDb[i].pBt;
    }
  }
  return 0;
}